

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endian.hpp
# Opt level: O0

uint16_t util::detail::byteswap(uint16_t value)

{
  uint16_t value_local;
  
  return value << 8 | value >> 8;
}

Assistant:

inline boost::uint16_t byteswap(boost::uint16_t value) {
#if INNOEXTRACT_HAVE_BUILTIN_BSWAP16
	return __builtin_bswap16(value);
#elif defined(_MSC_VER) && _MSC_VER >= 1300
	return _byteswap_ushort(value);
#elif INNOEXTRACT_HAVE_BSWAP_16 \
	&& (!defined(__GLIBC__) || !defined(__GLIBC_MINOR__) \
	    || (__GLIBC__ << 16) + __GLIBC_MINOR__ >= (2 << 16) + 16) \
	    // prevent conversion warnings
	return bswap_16(value);
#else
	return boost::uint16_t((boost::uint16_t(boost::uint8_t(value)) << 8)
	                       | boost::uint8_t(value >> 8));
#endif
}